

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O1

int Aig_NodeCompareRefsIncrease(Aig_Obj_t **pp1,Aig_Obj_t **pp2)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar5 = *(uint *)&(*pp1)->field_0x18 >> 6;
  uVar4 = *(uint *)&(*pp2)->field_0x18 >> 6;
  uVar3 = 0xffffffff;
  if ((uVar4 <= uVar5) && (uVar3 = 1, uVar5 == uVar4)) {
    iVar1 = (*pp2)->Id;
    uVar3 = 0xffffffff;
    iVar2 = (*pp1)->Id;
    if (iVar1 <= iVar2) {
      uVar3 = (uint)(iVar2 != iVar1);
    }
  }
  return uVar3;
}

Assistant:

int Aig_NodeCompareRefsIncrease( Aig_Obj_t ** pp1, Aig_Obj_t ** pp2 )
{
    int Diff = Aig_ObjRefs(*pp1) - Aig_ObjRefs(*pp2);
    if ( Diff < 0 )
        return -1;
    if ( Diff > 0 ) 
        return 1;
    Diff = Aig_ObjId(*pp1) - Aig_ObjId(*pp2);
    if ( Diff < 0 )
        return -1;
    if ( Diff > 0 ) 
        return 1;
    return 0; 
}